

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall
glslang::TVarGatherTraverser::visitSymbol(TVarGatherTraverser *this,TIntermSymbol *base)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  pointer ppVar3;
  undefined4 extraout_var_08;
  mapped_type *__dest;
  bool bVar4;
  byte local_79;
  _Self local_60;
  _Self local_58;
  iterator at;
  TVarEntryInfo ent;
  TVarLiveMap *target;
  TIntermSymbol *base_local;
  TVarGatherTraverser *this_local;
  
  ent.newIndex = 0;
  ent.stage = EShLangVertex;
  iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  if (((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) == 3) {
    ent._40_8_ = this->inputList;
  }
  else {
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    if (((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f) == 4) {
      ent._40_8_ = this->outputList;
    }
    else {
      iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
      bVar4 = TQualifier::isUniformOrBuffer((TQualifier *)CONCAT44(extraout_var_01,iVar2));
      if (bVar4) {
        iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
        bVar4 = TQualifier::isPushConstant((TQualifier *)CONCAT44(extraout_var_02,iVar2));
        if (!bVar4) {
          iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
          bVar4 = TQualifier::isShaderRecord((TQualifier *)CONCAT44(extraout_var_03,iVar2));
          if (!bVar4) {
            ent._40_8_ = this->uniformList;
            goto LAB_00646666;
          }
        }
      }
      iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
      if (((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8) & 0x7f) == 1) {
        iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
        TLiveTraverser::addGlobalReference
                  (&this->super_TLiveTraverser,(TString *)CONCAT44(extraout_var_05,iVar2));
      }
    }
  }
LAB_00646666:
  if (ent._40_8_ != 0) {
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
    at._M_node = (_Base_ptr)CONCAT44(extraout_var_06,iVar2);
    TIntermediate::getStage((this->super_TLiveTraverser).intermediate);
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                 *)ent._40_8_,(key_type *)CONCAT44(extraout_var_07,iVar2));
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                *)ent._40_8_);
    bVar1 = std::operator!=(&local_58,&local_60);
    bVar4 = false;
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      bVar4 = (_Base_ptr)(ppVar3->second).id == at._M_node;
    }
    if (bVar4) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      local_79 = 1;
      if (((ppVar3->second).live & 1U) == 0) {
        local_79 = (this->super_TLiveTraverser).traverseAll ^ 0xff;
      }
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
               ::operator->(&local_58);
      (ppVar3->second).live = (bool)(local_79 & 1);
    }
    else {
      iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
      __dest = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                             *)ent._40_8_,(key_type *)CONCAT44(extraout_var_08,iVar2));
      memcpy(__dest,&at,0x30);
    }
  }
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* base)
    {
        TVarLiveMap* target = nullptr;
        if (base->getQualifier().storage == EvqVaryingIn)
            target = &inputList;
        else if (base->getQualifier().storage == EvqVaryingOut)
            target = &outputList;
        else if (base->getQualifier().isUniformOrBuffer() && !base->getQualifier().isPushConstant() && !base->getQualifier().isShaderRecord())
            target = &uniformList;
        // If a global is being visited, then we should also traverse it incase it's evaluation
        // ends up visiting inputs we want to tag as live
        else if (base->getQualifier().storage == EvqGlobal)
            addGlobalReference(base->getAccessName());

        if (target) {
            TVarEntryInfo ent = {base->getId(), base, ! traverseAll, {}, {}, {}, {}, {}, {}, {}};
            ent.stage = intermediate.getStage();
            TVarLiveMap::iterator at = target->find(
                ent.symbol->getAccessName()); // std::lower_bound(target->begin(), target->end(), ent, TVarEntryInfo::TOrderById());
            if (at != target->end() && at->second.id == ent.id)
                at->second.live = at->second.live || ! traverseAll; // update live state
            else
                (*target)[ent.symbol->getAccessName()] = ent;
        }
    }